

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

void __thiscall
rangeless::fn::impl::
where<rangeless::fn::impl::in_sorted_by<std::vector<int,std::allocator<int>>,rangeless::fn::by::identity>>
::x_EraseRemove<std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
          (where<rangeless::fn::impl::in_sorted_by<std::vector<int,std::allocator<int>>,rangeless::fn::by::identity>>
           *this,vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *cont)

{
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_60;
  const_iterator local_58;
  in_sorted_by<std::vector<int,_std::allocator<int>_>,_rangeless::fn::by::identity> *local_50;
  X *local_48;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_40;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_38;
  const_iterator local_30;
  undefined8 local_28;
  in_sorted_by<std::vector<int,_std::allocator<int>_>,_rangeless::fn::by::identity> pred_copy;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *cont_local;
  where<rangeless::fn::impl::in_sorted_by<std::vector<int,_std::allocator<int>_>,_rangeless::fn::by::identity>_>
  *this_local;
  
  local_28 = *(undefined8 *)this;
  pred_copy.r = *(vector<int,_std::allocator<int>_> **)(this + 8);
  pred_copy._8_8_ = cont;
  local_40._M_current =
       (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::begin
                      (cont);
  local_48 = (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                            ((vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                              *)pred_copy._8_8_);
  local_50 = (in_sorted_by<std::vector<int,_std::allocator<int>_>,_rangeless::fn::by::identity> *)
             &local_28;
  local_38 = std::
             remove_if<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>,rangeless::fn::impl::where<rangeless::fn::impl::in_sorted_by<std::vector<int,std::allocator<int>>,rangeless::fn::by::identity>>::x_EraseRemove<std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>(std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>&)const::_lambda(rangeless::fn::impl::X_const&)_1_>
                       (local_40,(__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                                  )local_48,(anon_class_8_1_c4b27973_for__M_pred_conflict)local_50);
  __gnu_cxx::
  __normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
  ::__normal_iterator<rangeless::fn::impl::X*>
            ((__normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
              *)&local_30,&local_38);
  local_60._M_current =
       (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                      ((vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *)
                       pred_copy._8_8_);
  __gnu_cxx::
  __normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
  ::__normal_iterator<rangeless::fn::impl::X*>
            ((__normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
              *)&local_58,&local_60);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::erase
            (cont,local_30,local_58);
  return;
}

Assistant:

void x_EraseRemove(Container& cont) const
        {
            auto pred_copy = pred;
            cont.erase(
                std::remove_if(
                    cont.begin(), cont.end(),
                    [&pred_copy](const typename Container::value_type& x)
                    {
                        return !pred_copy(x);
                    }),
                cont.end());

           // Using std::not1(pred) instead of the lambda above won't compile:
           // error: no type named 'argument_type'...
           // Can't use std::not_fn because that's c++17.
        }